

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O0

void __thiscall TRM::TinyRender::triangle(TinyRender *this,Vec3f *pts,TGAColor *colors)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  byte bVar6;
  byte bVar7;
  TGAImage *this_00;
  vec<3,_float,_(glm::qualifier)0> P;
  vec<3,_float,_(glm::qualifier)0> A;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar8;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar9;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar10;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar11;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aVar12;
  int iVar13;
  int iVar14;
  float *pfVar15;
  int *piVar16;
  float *pfVar17;
  float *__b;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 *paVar18;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 *paVar19;
  Vec3f VVar20;
  TGAColor local_121;
  undefined1 auStack_11c [3];
  TGAColor c;
  float pz;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_110;
  undefined1 local_8c [8];
  Vec3f bc_screen;
  Vec3f p;
  int local_6c;
  int j;
  int i_1;
  Vec2f clamp;
  Vec2f bboxmax;
  Vec2f bboxmin;
  size_t i;
  Vec2i ptis [3];
  int width;
  TGAColor *colors_local;
  Vec3f *pts_local;
  TinyRender *this_local;
  
  TGAImage::get_width(this->mImage);
  bboxmin.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  bboxmin.field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  for (; (ulong)bboxmin < 3; bboxmin = (Vec2f)((long)bboxmin + 1)) {
    pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pts + (long)bboxmin,0);
    fVar1 = *pfVar15;
    piVar16 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](ptis + (long)bboxmin + -1,0);
    *piVar16 = (int)(fVar1 + 0.5);
    pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pts + (long)bboxmin,1);
    fVar1 = *pfVar15;
    piVar16 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](ptis + (long)bboxmin + -1,1);
    *piVar16 = (int)(fVar1 + 0.5);
  }
  iVar13 = TGAImage::get_width(this->mImage);
  iVar14 = TGAImage::get_height(this->mImage);
  glm::vec<2,float,(glm::qualifier)0>::vec<int,int>
            ((vec<2,float,(glm::qualifier)0> *)&bboxmax,iVar13 + -1,iVar14 + -1);
  memset(&clamp,0,8);
  iVar13 = TGAImage::get_width(this->mImage);
  iVar14 = TGAImage::get_height(this->mImage);
  glm::vec<2,float,(glm::qualifier)0>::vec<int,int>
            ((vec<2,float,(glm::qualifier)0> *)&j,iVar13 + -1,iVar14 + -1);
  for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
    for (p.field_2.z = 0.0; (int)p.field_2 < 2; p.field_2.z = p.field_2.z + 1) {
      p.field_1.y = 0.0;
      pfVar15 = glm::vec<2,_float,_(glm::qualifier)0>::operator[](&bboxmax,(length_type)p.field_2);
      pfVar17 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                          (pts + local_6c,(length_type)p.field_2);
      pfVar15 = std::min<float>(pfVar15,pfVar17);
      pfVar15 = std::max<float>(&p.field_1.y,pfVar15);
      fVar1 = *pfVar15;
      pfVar15 = glm::vec<2,_float,_(glm::qualifier)0>::operator[](&bboxmax,(length_type)p.field_2);
      *pfVar15 = fVar1;
      pfVar15 = glm::vec<2,_float,_(glm::qualifier)0>::operator[]
                          ((vec<2,_float,_(glm::qualifier)0> *)&j,(length_type)p.field_2);
      pfVar17 = glm::vec<2,_float,_(glm::qualifier)0>::operator[](&clamp,(length_type)p.field_2);
      __b = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pts + local_6c,(length_type)p.field_2)
      ;
      pfVar17 = std::max<float>(pfVar17,__b);
      pfVar15 = std::min<float>(pfVar15,pfVar17);
      fVar1 = *pfVar15;
      pfVar15 = glm::vec<2,_float,_(glm::qualifier)0>::operator[](&clamp,(length_type)p.field_2);
      *pfVar15 = fVar1;
    }
  }
  paVar18 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 *)
            glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                      ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,0);
  *paVar18 = bboxmax.field_0;
  while (pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                             ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,0),
        aVar12 = bboxmax.field_1, *pfVar15 <= clamp.field_0.x) {
    paVar19 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 *)
              glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                        ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,1);
    *paVar19 = aVar12;
    while (pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                               ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,1),
          *pfVar15 <= clamp.field_1.y) {
      A.field_0 = pts->field_0;
      A.field_1 = pts->field_1;
      A.field_2 = pts->field_2;
      P.field_1.y = bc_screen.field_2.z;
      P.field_0.x = bc_screen.field_1.y;
      P.field_2.z = p.field_0.x;
      VVar20 = barycentric<3ul>(A,pts[1],pts[2],P);
      stack0xfffffffffffffee8 = VVar20._0_8_;
      local_8c[0] = c.bgra[1];
      local_8c[1] = c.bgra[2];
      local_8c[2] = c.bgra[3];
      local_8c[3] = c.bytespp;
      local_8c._4_4_ = pz;
      local_110 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)VVar20.field_2;
      bc_screen.field_0 = local_110;
      unique0x10000823 = VVar20;
      pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                          ((vec<3,_float,_(glm::qualifier)0> *)local_8c,0);
      if (((0.0 < *pfVar15 || *pfVar15 == 0.0) &&
          (pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                               ((vec<3,_float,_(glm::qualifier)0> *)local_8c,1),
          0.0 < *pfVar15 || *pfVar15 == 0.0)) &&
         (pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_8c,2),
         0.0 < *pfVar15 || *pfVar15 == 0.0)) {
        pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pts,2);
        fVar1 = *pfVar15;
        pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                            ((vec<3,_float,_(glm::qualifier)0> *)local_8c,0);
        fVar2 = *pfVar15;
        pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pts + 1,2);
        fVar3 = *pfVar15;
        pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                            ((vec<3,_float,_(glm::qualifier)0> *)local_8c,1);
        fVar4 = *pfVar15;
        pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pts + 2,2);
        fVar5 = *pfVar15;
        pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                            ((vec<3,_float,_(glm::qualifier)0> *)local_8c,2);
        aVar10 = bc_screen.field_2;
        aVar8 = bc_screen.field_1;
        _auStack_11c = fVar5 * *pfVar15 + fVar1 * fVar2 + fVar3 * fVar4;
        pfVar15 = this->mZBuffer;
        iVar13 = TGAImage::get_width(this->mImage);
        aVar11 = bc_screen.field_2;
        aVar9 = bc_screen.field_1;
        fVar1 = _auStack_11c;
        if (_auStack_11c <= pfVar15[(int)(aVar10.z * (float)iVar13 + aVar8.y)]) {
          pfVar15 = this->mZBuffer;
          iVar13 = TGAImage::get_width(this->mImage);
          pfVar15[(int)(aVar11.z * (float)iVar13 + aVar9.y)] = fVar1;
          TGAColor::TGAColor(&local_121);
          pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_8c,0);
          fVar1 = *pfVar15;
          bVar6 = colors->bgra[0];
          pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_8c,1);
          fVar2 = *pfVar15;
          bVar7 = colors[1].bgra[0];
          pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_8c,2);
          local_121.bgra[0] =
               (uchar)(int)(*pfVar15 * (float)colors[2].bgra[0] +
                           fVar1 * (float)bVar6 + fVar2 * (float)bVar7);
          pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_8c,0);
          fVar1 = *pfVar15;
          bVar6 = colors->bgra[1];
          pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_8c,1);
          fVar2 = *pfVar15;
          bVar7 = colors[1].bgra[1];
          pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_8c,2);
          local_121.bgra[1] =
               (uchar)(int)(*pfVar15 * (float)colors[2].bgra[1] +
                           fVar1 * (float)bVar6 + fVar2 * (float)bVar7);
          pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_8c,0);
          fVar1 = *pfVar15;
          bVar6 = colors->bgra[2];
          pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_8c,1);
          fVar2 = *pfVar15;
          bVar7 = colors[1].bgra[2];
          pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_8c,2);
          local_121.bgra[2] =
               (uchar)(int)(*pfVar15 * (float)colors[2].bgra[2] +
                           fVar1 * (float)bVar6 + fVar2 * (float)bVar7);
          this_00 = this->mImage;
          pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,0);
          fVar1 = *pfVar15;
          pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,1);
          TGAImage::set(this_00,(int)fVar1,(int)*pfVar15,&local_121);
        }
      }
      pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                          ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,1);
      *pfVar15 = *pfVar15 + 1.0;
    }
    pfVar15 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                        ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,0);
    *pfVar15 = *pfVar15 + 1.0;
  }
  return;
}

Assistant:

void TinyRender::triangle(Vec3f* pts, TGAColor* colors) {
  int width = mImage->get_width();

  Vec2i ptis[3];
  for (size_t i = 0; i < 3; i++) {
    ptis[i][0] = int(pts[i][0] + .5f);
    ptis[i][1] = int(pts[i][1] + .5f);
  }

  Vec2f bboxmin(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  Vec2f bboxmax(0, 0);
  Vec2f clamp(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = std::max(0.f, std::min(bboxmin[j], pts[i][j]));
      bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
    }
  }

  Vec3f p;
  for (p[0] = bboxmin.x; p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = bboxmin.y; p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<3>(pts[0], pts[1], pts[2], p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;

      float pz = pts[0][2] * bc_screen[0] + pts[1][2] * bc_screen[1] +
                 pts[2][2] * bc_screen[2];

      if (mZBuffer[int(p.x + p.y * mImage->get_width())] < pz) continue;

      mZBuffer[int(p.x + p.y * mImage->get_width())] = pz;

      TGAColor c;
      /*
          barycentric result can also interpolation Color
      */
      c.bgra[0] = bc_screen[0] * colors[0].bgra[0] +
                  bc_screen[1] * colors[1].bgra[0] +
                  bc_screen[2] * colors[2].bgra[0];
      c.bgra[1] = bc_screen[0] * colors[0].bgra[1] +
                  bc_screen[1] * colors[1].bgra[1] +
                  bc_screen[2] * colors[2].bgra[1];
      c.bgra[2] = bc_screen[0] * colors[0].bgra[2] +
                  bc_screen[1] * colors[1].bgra[2] +
                  bc_screen[2] * colors[2].bgra[2];

      mImage->set(p[0], p[1], c);
    }
  }
}